

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Chapter::ShallowCopy(Chapter *this,Chapter *dst)

{
  Chapter *dst_local;
  Chapter *this_local;
  
  dst->id_ = this->id_;
  dst->start_timecode_ = this->start_timecode_;
  dst->end_timecode_ = this->end_timecode_;
  dst->uid_ = this->uid_;
  dst->displays_ = this->displays_;
  dst->displays_size_ = this->displays_size_;
  dst->displays_count_ = this->displays_count_;
  return;
}

Assistant:

void Chapter::ShallowCopy(Chapter* dst) const {
  dst->id_ = id_;
  dst->start_timecode_ = start_timecode_;
  dst->end_timecode_ = end_timecode_;
  dst->uid_ = uid_;
  dst->displays_ = displays_;
  dst->displays_size_ = displays_size_;
  dst->displays_count_ = displays_count_;
}